

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFSystemError.cc
# Opt level: O2

string * QPDFSystemError::createWhat
                   (string *__return_storage_ptr__,string *description,int system_errno)

{
  char *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&bStack_58,description,": ");
  __rhs = strerror(system_errno);
  std::operator+(&local_38,&bStack_58,__rhs);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&bStack_58);
  return __return_storage_ptr__;
}

Assistant:

std::string
QPDFSystemError::createWhat(std::string const& description, int system_errno)
{
    std::string message;
#ifdef _MSC_VER
    // "94" is mentioned in the MSVC docs, but it's still safe if the
    // message is longer.  strerror_s is a templated function that
    // knows the size of buf and truncates.
    char buf[94];
    if (strerror_s(buf, system_errno) != 0) {
        message = description + ": failed with an unknown error";
    } else {
        message = description + ": " + buf;
    }
#else
    message = description + ": " + strerror(system_errno);
#endif
    return message;
}